

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

int __thiscall problem_parser::get_variable(problem_parser *this,string_view value)

{
  int iVar1;
  const_iterator cVar2;
  key_type local_10;
  
  local_10._M_str = value._M_str;
  local_10._M_len = value._M_len;
  cVar2 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_cache_variable)._M_h,&local_10);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = *(int *)((long)cVar2.
                           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                           ._M_cur + 0x18);
  }
  return iVar1;
}

Assistant:

int get_variable(const std::string_view value) const noexcept
    {
        if (auto it = m_cache_variable.find(value);
            it != m_cache_variable.end())
            return it->second;

        return -1;
    }